

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::portmap_error_alert::portmap_error_alert
          (portmap_error_alert *this,stack_allocator *param_1,port_mapping_t i,portmap_transport t,
          error_code *e)

{
  error_category *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined3 uVar5;
  rep rVar6;
  undefined3 in_register_00000009;
  string local_40;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_0045fff0;
  rVar6 = std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar6;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__portmap_error_alert_00460c50;
  (this->mapping).m_val = i.m_val;
  this->map_transport = t;
  bVar4 = e->failed_;
  uVar5 = *(undefined3 *)&e->field_0x5;
  uVar2 = *(undefined4 *)&e->cat_;
  uVar3 = *(undefined4 *)((long)&e->cat_ + 4);
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar4;
  *(undefined3 *)&(this->error).field_0x5 = uVar5;
  *(undefined4 *)&(this->error).cat_ = uVar2;
  *(undefined4 *)((long)&(this->error).cat_ + 4) = uVar3;
  this->map_type = CONCAT31(in_register_00000009,t);
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_40,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&this->msg,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

portmap_error_alert::portmap_error_alert(aux::stack_allocator&
		, port_mapping_t const i, portmap_transport const t, error_code const& e)
		: mapping(i)
		, map_transport(t)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, map_type(static_cast<int>(t))
		, msg(convert_from_native(error.message()))
#endif
	{}